

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O0

ssize_t __thiscall axl::io::Ssl::write(Ssl *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 in_register_00000034;
  Ssl *unaff_retaddr;
  int result;
  undefined8 in_stack_fffffffffffffff8;
  int retCode;
  long lVar2;
  
  retCode = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  iVar1 = SSL_write((SSL *)(this->super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>
                           ).m_h,(void *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  if (iVar1 < 0) {
    setError(unaff_retaddr,retCode);
    lVar2 = -1;
  }
  else {
    lVar2 = (long)iVar1;
  }
  return lVar2;
}

Assistant:

size_t
Ssl::write(
	const void* p,
	size_t size
) {
	ASSERT(m_h);

	int result = ::SSL_write(m_h, p, (int)size);
	if (result < 0) {
		setError(result);
		return -1;
	}

	return result;
}